

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O1

PolyNf * __thiscall
Inferences::PolynomialEvaluation::simplifySummation<Kernel::NumTraits<Kernel::IntegerConstantType>>
          (PolyNf *__return_storage_ptr__,PolynomialEvaluation *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *summands,
          bool removeZeros)

{
  Entry *pEVar1;
  long lVar2;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  *pDVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  undefined7 in_register_00000009;
  Entry *pEVar8;
  __mpz_struct *u;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar9;
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  *pRVar10;
  bool bVar11;
  anon_class_16_2_f84bbffd f;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> monom;
  Numeral numeral;
  int local_110;
  char local_10c;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_108;
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  *local_e8;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_e0;
  __mpz_struct local_d8;
  int local_c8;
  undefined4 uStack_c4;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMStack_c0;
  uint local_b8 [4];
  __mpz_struct local_a8;
  __mpz_struct local_98;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_88;
  __mpz_struct local_68;
  __mpz_struct local_58;
  AnyPoly local_48;
  
  pEVar8 = (this->_memo)._memo._entries;
  pEVar1 = (this->_memo)._memo._afterLast;
  local_e8 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              *)__return_storage_ptr__;
  if (pEVar8 != pEVar1) {
    uVar7 = (long)pEVar1 - (long)pEVar8 >> 5;
    lVar4 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar8,pEVar1,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e,
               CONCAT71(in_register_00000009,removeZeros));
    std::
    __final_insertion_sort<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar8,pEVar1);
  }
  pEVar8 = (this->_memo)._memo._entries;
  if ((this->_memo)._memo._afterLast == pEVar8) {
    local_110 = 0;
  }
  else {
    uVar7 = 0;
    local_110 = 0;
    do {
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&local_108,
                 (IntegerConstantType *)(&pEVar8->code + uVar7 * 8));
      local_108._summands._cursor =
           (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
           CONCAT44(local_108._summands._cursor._4_4_,
                    *(undefined4 *)((long)&pEVar8->_key + uVar7 * 0x20 + 0xc));
      local_108._summands._end =
           *(Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)
            ((long)&pEVar8->_key + uVar7 * 0x20 + 0x14);
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&local_58,(IntegerConstantType *)&local_108);
      iVar5 = (int)local_108._summands._cursor;
      local_e0 = local_108._summands._end;
      uVar7 = (ulong)((int)uVar7 + 1);
      pEVar8 = (this->_memo)._memo._entries;
      if (uVar7 < (ulong)((long)(this->_memo)._memo._afterLast - (long)pEVar8 >> 5)) {
        do {
          if (*(int *)((long)&pEVar8->_key + uVar7 * 0x20 + 0xc) != iVar5) break;
          Kernel::IntegerConstantType::operator+
                    ((IntegerConstantType *)&local_d8,(IntegerConstantType *)&local_58);
          mpz_swap(&local_58,&local_d8);
          mpz_clear(&local_d8);
          uVar7 = (ulong)((int)uVar7 + 1);
          pEVar8 = (this->_memo)._memo._entries;
        } while (uVar7 < (ulong)((long)(this->_memo)._memo._afterLast - (long)pEVar8 >> 5));
      }
      bVar11 = true;
      local_10c = (char)summands;
      if (local_10c != '\0') {
        Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_98,0);
        iVar6 = mpz_cmp(&local_58,&local_98);
        bVar11 = iVar6 != 0;
        mpz_clear(&local_98);
      }
      if (bVar11) {
        Kernel::IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)&local_68,(IntegerConstantType *)&local_58);
        Kernel::IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)&local_d8,(IntegerConstantType *)&local_68);
        local_c8 = iVar5;
        pMStack_c0 = local_e0;
        u = (__mpz_struct *)(&((this->_memo)._memo._entries)->code + (long)local_110 * 8);
        mpz_swap(u,&local_d8);
        u[1]._mp_alloc = local_c8;
        u[1]._mp_size = uStack_c4;
        u[1]._mp_d = (mp_limb_t *)pMStack_c0;
        mpz_clear(&local_d8);
        mpz_clear(&local_68);
        local_110 = local_110 + 1;
      }
      mpz_clear(&local_58);
      mpz_clear((__mpz_struct *)&local_108);
      pEVar8 = (this->_memo)._memo._entries;
    } while (uVar7 < (ulong)((long)(this->_memo)._memo._afterLast - (long)pEVar8 >> 5));
  }
  for (pEVar8 = (Entry *)(&pEVar8->code + (long)local_110 * 8);
      pEVar8 != (this->_memo)._memo._afterLast; pEVar8 = (Entry *)((pEVar8->_value).__data + 4)) {
    mpz_clear((__mpz_struct *)pEVar8);
  }
  pEVar8 = (this->_memo)._memo._entries;
  (this->_memo)._memo._afterLast = (Entry *)((__mpz_struct *)&pEVar8->code + (long)local_110 * 2);
  if (local_110 == 1) {
    Kernel::IntegerConstantType::IntegerConstantType
              ((IntegerConstantType *)&local_a8,(IntegerConstantType *)pEVar8);
    local_108._summands._capacity = CONCAT44(local_108._summands._capacity._4_4_,1);
    bVar11 = Kernel::operator==((IntegerConstantType *)&local_a8,(int *)&local_108);
    if ((bVar11) &&
       (lVar4 = *(long *)((long)&((this->_memo)._memo._entries)->_key + 0x14),
       lVar2 = *(long *)(lVar4 + 8),
       (int)((ulong)(*(long *)(lVar4 + 0x10) - lVar2) >> 2) * -0x49249249 == 1)) {
      bVar11 = *(int *)(lVar2 + 0x18) == 1;
      goto LAB_00508800;
    }
  }
  bVar11 = false;
LAB_00508800:
  if (local_110 == 1) {
    mpz_clear(&local_a8);
  }
  pRVar10 = local_e8;
  if (bVar11) {
    pDVar3 = *(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
               **)(*(long *)((long)&((this->_memo)._memo._entries)->_key + 0x14) + 8);
    *(undefined8 *)local_e8 = 0;
    *(undefined8 *)(local_e8 + 8) = 0;
    *(undefined8 *)(local_e8 + 0x10) = 0;
    *local_e8 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                 )(*(byte *)&(pDVar3->
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                             ).
                             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                  & 3);
    f.other = pDVar3;
    f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
              *)local_e8;
    ::Lib::CoproductImpl::
    RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
              (local_e8,f);
  }
  else {
    Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
              (&local_108,
               (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)this);
    local_88._summands._cursor = local_108._summands._cursor;
    local_88._summands._capacity = local_108._summands._capacity;
    local_108._summands._capacity = 0;
    local_88._summands._end = local_108._summands._end;
    local_108._summands._end = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    local_108._summands._cursor = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    local_88._summands._stack = local_108._summands._stack;
    local_108._summands._stack = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    ::Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)local_b8,&local_88);
    pRVar10 = local_e8;
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[7] = '\0';
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._0_8_ = (ulong)local_b8[0] << 8;
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content._8_7_ = SUB87(local_b8._8_8_,0);
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[0xf] = SUB81(local_b8._8_8_,7);
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._17_3_ = 0;
    Kernel::PolyNf::PolyNf((PolyNf *)local_e8,&local_48);
    pMVar9 = local_88._summands._cursor;
    while (pMVar9 != local_88._summands._stack) {
      pMVar9 = pMVar9 + -1;
      mpz_clear((__mpz_struct *)pMVar9);
    }
    pMVar9 = local_108._summands._cursor;
    if (local_88._summands._stack != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0)
    {
      uVar7 = local_88._summands._capacity << 5;
      if (uVar7 == 0) {
        ((local_88._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        ((local_88._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_88._summands._stack;
      }
      else if (uVar7 < 0x21) {
        ((local_88._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        ((local_88._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_88._summands._stack;
      }
      else if (uVar7 < 0x31) {
        ((local_88._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        ((local_88._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_88._summands._stack;
      }
      else if (uVar7 < 0x41) {
        ((local_88._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        ((local_88._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_88._summands._stack;
      }
      else {
        operator_delete(local_88._summands._stack,0x10);
        pMVar9 = local_108._summands._cursor;
      }
    }
    while (pMVar9 != local_108._summands._stack) {
      mpz_clear((__mpz_struct *)(pMVar9 + -1));
      pMVar9 = pMVar9 + -1;
    }
    if (local_108._summands._stack != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0)
    {
      uVar7 = local_108._summands._capacity << 5;
      if (uVar7 == 0) {
        ((local_108._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        ((local_108._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_108._summands._stack;
      }
      else if (uVar7 < 0x21) {
        ((local_108._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        ((local_108._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_108._summands._stack;
      }
      else if (uVar7 < 0x31) {
        ((local_108._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        ((local_108._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_108._summands._stack;
      }
      else if (uVar7 < 0x41) {
        ((local_108._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        ((local_108._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_108._summands._stack;
      }
      else {
        operator_delete(local_108._summands._stack,0x10);
      }
    }
  }
  return (PolyNf *)pRVar10;
}

Assistant:

PolyNf PolynomialEvaluation::simplifySummation(Stack<Monom<Number>> summands, bool removeZeros)
{ 
  using Monom   = Monom<Number>;
  using Polynom = Polynom<Number>;

  // then we sort them by their monom, in order to add up the coefficients efficiently
  std::sort(summands.begin(), summands.end());

  // add up the coefficients (in place)
  {
    auto offs = 0;
    for (unsigned i = 0; i < summands.size(); i++) { 
      auto monom = summands[i];
      auto numeral = monom.numeral;
      auto factors = monom.factors;
      while ( i + 1 < summands.size() && summands[i+1].factors == factors ) {
        numeral = numeral + summands[i+1].numeral;
        i++;
      }
      if (!removeZeros || numeral != Number::constant(0)) 
        summands[offs++] = Monom(numeral, factors);
    }
    summands.truncate(offs);
  }

  if (summands.size() == 1 
      && summands[0].numeral == 1
      && summands[0].factors->nFactors() == 1
      && summands[0].factors->factorAt(0).power == 1
      ) {
    return summands[0].factors->factorAt(0).term;
  } else {
    auto poly = Polynom(std::move(summands));
    poly.integrity();
    return PolyNf(AnyPoly(perfect(std::move(poly))));
  }
}